

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inv_translator_app.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  undefined1 local_270 [32];
  InverseTranslator local_250;
  string local_228 [4];
  int n;
  string word;
  istringstream local_208 [8];
  istringstream str;
  string local_78 [8];
  string line;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  InverseTranslator InvTranslator;
  char **argv_local;
  int argc_local;
  
  InverseTranslator::InverseTranslator
            ((InverseTranslator *)
             &words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
  std::__cxx11::string::string(local_78);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_78);
  std::__cxx11::istringstream::istringstream(local_208,local_78,8);
  std::__cxx11::string::string(local_228);
  while( true ) {
    piVar2 = std::operator>>((istream *)local_208,local_228);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(value_type *)local_228);
  }
  local_250._36_4_ = 0;
  while( true ) {
    uVar3 = (ulong)(int)local_250._36_4_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    if (sVar4 - 1 <= uVar3) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58,(long)(int)local_250._36_4_);
    InverseTranslator::translate
              ((InverseTranslator *)(local_270 + 0x20),
               (string *)
               &words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)(local_270 + 0x20));
    std::operator<<(poVar5," ");
    std::__cxx11::string::~string((string *)(local_270 + 0x20));
    local_250._36_4_ = local_250._36_4_ + 1;
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
    InverseTranslator::translate
              ((InverseTranslator *)local_270,
               (string *)
               &words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<((ostream *)&std::cout,(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string(local_228);
  std::__cxx11::istringstream::~istringstream(local_208);
  std::__cxx11::string::~string(local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  InverseTranslator::~InverseTranslator
            ((InverseTranslator *)
             &words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(int argc, char** argv){

    InverseTranslator InvTranslator;
    std::vector<std::string> words;
    
    std::string line;
    getline(std::cin, line);
    
    std::istringstream str(line);
    std::string word;
        
    while( str >> word ) {
      words.push_back(word);
    }
      
    for(int n = 0; n < words.size()-1; n++) {
        std::cout << InvTranslator.translate(words[n]) << " ";
    }

    if (!words.empty()) {
        std::cout << InvTranslator.translate(words.back());
    }
    std::cout << '\n';

    return 0;
}